

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 152.test.cpp
# Opt level: O2

void verifyChunkWithOneDilution(Type<2,_152> *chunk)

{
  range_reference_t<D<true>_> pdVar1;
  ulong uVar2;
  StringRef macroName;
  StringRef macroName_00;
  StringRef macroName_01;
  StringRef macroName_02;
  StringRef macroName_03;
  StringRef macroName_04;
  StringRef macroName_05;
  StringRef macroName_06;
  StringRef macroName_07;
  StringRef macroName_08;
  StringRef macroName_09;
  StringRef macroName_10;
  StringRef macroName_11;
  StringRef macroName_12;
  StringRef macroName_13;
  StringRef macroName_14;
  StringRef macroName_15;
  StringRef macroName_16;
  StringRef macroName_17;
  StringRef macroName_18;
  StringRef macroName_19;
  StringRef macroName_20;
  StringRef macroName_21;
  StringRef macroName_22;
  StringRef macroName_23;
  StringRef macroName_24;
  StringRef macroName_25;
  StringRef macroName_26;
  StringRef macroName_27;
  StringRef macroName_28;
  StringRef macroName_29;
  StringRef macroName_30;
  StringRef macroName_31;
  StringRef macroName_32;
  StringRef macroName_33;
  StringRef macroName_34;
  StringRef macroName_35;
  StringRef macroName_36;
  StringRef macroName_37;
  StringRef macroName_38;
  StringRef macroName_39;
  StringRef macroName_40;
  StringRef macroName_41;
  StringRef macroName_42;
  StringRef macroName_43;
  StringRef macroName_44;
  StringRef macroName_45;
  StringRef macroName_46;
  StringRef macroName_47;
  StringRef macroName_48;
  StringRef macroName_49;
  StringRef macroName_50;
  StringRef macroName_51;
  StringRef macroName_52;
  StringRef macroName_53;
  StringRef macroName_54;
  StringRef macroName_55;
  StringRef capturedExpression;
  StringRef capturedExpression_00;
  StringRef capturedExpression_01;
  StringRef capturedExpression_02;
  StringRef capturedExpression_03;
  StringRef capturedExpression_04;
  StringRef capturedExpression_05;
  StringRef capturedExpression_06;
  StringRef capturedExpression_07;
  StringRef capturedExpression_08;
  StringRef capturedExpression_09;
  StringRef capturedExpression_10;
  StringRef capturedExpression_11;
  StringRef capturedExpression_12;
  StringRef capturedExpression_13;
  StringRef capturedExpression_14;
  StringRef capturedExpression_15;
  StringRef capturedExpression_16;
  StringRef capturedExpression_17;
  StringRef capturedExpression_18;
  StringRef capturedExpression_19;
  StringRef capturedExpression_20;
  StringRef capturedExpression_21;
  StringRef capturedExpression_22;
  StringRef capturedExpression_23;
  StringRef capturedExpression_24;
  StringRef capturedExpression_25;
  StringRef capturedExpression_26;
  StringRef capturedExpression_27;
  StringRef capturedExpression_28;
  StringRef capturedExpression_29;
  StringRef capturedExpression_30;
  StringRef capturedExpression_31;
  StringRef capturedExpression_32;
  StringRef capturedExpression_33;
  StringRef capturedExpression_34;
  StringRef capturedExpression_35;
  StringRef capturedExpression_36;
  StringRef capturedExpression_37;
  StringRef capturedExpression_38;
  StringRef capturedExpression_39;
  StringRef capturedExpression_40;
  StringRef capturedExpression_41;
  StringRef capturedExpression_42;
  StringRef capturedExpression_43;
  StringRef capturedExpression_44;
  StringRef capturedExpression_45;
  StringRef capturedExpression_46;
  StringRef capturedExpression_47;
  StringRef capturedExpression_48;
  StringRef capturedExpression_49;
  StringRef capturedExpression_50;
  StringRef capturedExpression_51;
  StringRef capturedExpression_52;
  StringRef capturedExpression_53;
  StringRef capturedExpression_54;
  StringRef capturedExpression_55;
  AssertionHandler catchAssertionHandler;
  undefined8 local_f0;
  undefined1 local_e8 [8];
  undefined8 local_e0;
  char *local_d8;
  undefined1 local_d0 [8];
  int local_c8;
  undefined4 uStack_c4;
  double local_c0;
  undefined1 local_a8 [8];
  bool local_a0;
  bool bStack_9f;
  undefined6 uStack_9e;
  __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_> local_98;
  WithinRelMatcher *local_90;
  undefined1 local_88 [8];
  bool local_80;
  bool bStack_7f;
  undefined2 uStack_7e;
  undefined4 uStack_7c;
  _Head_base<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_false>
  local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70 [2];
  range_reference_t<D<true>_>_conflict local_50;
  
  local_e8 = (undefined1  [8])0x184484;
  local_e0 = (pointer)0xef;
  macroName.m_size = 5;
  macroName.m_start = "CHECK";
  capturedExpression.m_size = 0x11;
  capturedExpression.m_start = "152 == chunk.MT()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName,(SourceLineInfo *)local_e8,capturedExpression,
             ContinueOnFailure);
  local_e0._0_2_ = 0x101;
  local_e8 = (undefined1  [8])&PTR_streamReconstructedExpression_001d32f0;
  local_e0._4_4_ = 0x98;
  local_d8 = "==";
  local_d0 = (undefined1  [8])0x2;
  local_c8 = 0x98;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_e8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_e8);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_e8 = (undefined1  [8])0x184484;
  local_e0 = (pointer)0xf0;
  macroName_00.m_size = 5;
  macroName_00.m_start = "CHECK";
  capturedExpression_00.m_size = 0x1c;
  capturedExpression_00.m_start = "152 == chunk.sectionNumber()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_00,(SourceLineInfo *)local_e8,capturedExpression_00,
             ContinueOnFailure);
  local_e0._0_2_ = 0x101;
  local_e8 = (undefined1  [8])&PTR_streamReconstructedExpression_001d32f0;
  local_e0._4_4_ = 0x98;
  local_d8 = "==";
  local_d0 = (undefined1  [8])0x2;
  local_c8 = 0x98;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_e8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_e8);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_e8 = (undefined1  [8])0x184484;
  local_e0 = (pointer)0xf2;
  macroName_01.m_size = 5;
  macroName_01.m_start = "CHECK";
  capturedExpression_01.m_size = 0x13;
  capturedExpression_01.m_start = "94239 == chunk.ZA()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_01,(SourceLineInfo *)local_e8,capturedExpression_01,
             ContinueOnFailure);
  local_c8 = (chunk->super_BaseWithoutMT<njoy::ENDFtk::section::Type<2,_152>_>).ZA_;
  local_e0._1_1_ = local_c8 == 0x1701f;
  local_e0._0_1_ = true;
  local_e8 = (undefined1  [8])&PTR_streamReconstructedExpression_001d32f0;
  local_e0._4_4_ = 0x1701f;
  local_d8 = "==";
  local_d0 = (undefined1  [8])0x2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_e8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_e8);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_e8 = (undefined1  [8])0x184484;
  local_e0 = (pointer)0xf3;
  macroName_02.m_size = 5;
  macroName_02.m_start = "CHECK";
  capturedExpression_02.m_size = 0x21;
  capturedExpression_02.m_start = "94239 == chunk.targetIdentifier()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_02,(SourceLineInfo *)local_e8,capturedExpression_02,
             ContinueOnFailure);
  local_c8 = (chunk->super_BaseWithoutMT<njoy::ENDFtk::section::Type<2,_152>_>).ZA_;
  local_e0._1_1_ = local_c8 == 0x1701f;
  local_e0._0_1_ = true;
  local_e8 = (undefined1  [8])&PTR_streamReconstructedExpression_001d32f0;
  local_e0._4_4_ = 0x1701f;
  local_d8 = "==";
  local_d0 = (undefined1  [8])0x2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_e8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_e8);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_e8 = (undefined1  [8])0x184484;
  local_e0 = (pointer)0xf4;
  macroName_03.m_size = 10;
  macroName_03.m_start = "CHECK_THAT";
  capturedExpression_03.m_size = 0x25;
  capturedExpression_03.m_start = "2.369986e+2, WithinRel( chunk.AWR() )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_03,(SourceLineInfo *)local_e8,capturedExpression_03,
             ContinueOnFailure);
  local_a8 = (undefined1  [8])0x406d9ff487fcb924;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_e8,
             (chunk->super_BaseWithoutMT<njoy::ENDFtk::section::Type<2,_152>_>).atomicWeightRatio_);
  bStack_7f = Catch::Matchers::WithinRelMatcher::match
                        ((WithinRelMatcher *)local_e8,(double *)local_a8);
  local_80 = true;
  local_88 = (undefined1  [8])&PTR_streamReconstructedExpression_001d3330;
  local_78._M_head_impl._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)local_a8;
  local_70[0]._0_8_ = (WithinRelMatcher *)local_e8;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_88);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_88);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_e8);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_e8 = (undefined1  [8])0x184484;
  local_e0 = (pointer)0xf5;
  macroName_04.m_size = 10;
  macroName_04.m_start = "CHECK_THAT";
  capturedExpression_04.m_size = 0x33;
  capturedExpression_04.m_start = "2.369986e+2, WithinRel( chunk.atomicWeightRatio() )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_04,(SourceLineInfo *)local_e8,capturedExpression_04,
             ContinueOnFailure);
  local_a8 = (undefined1  [8])0x406d9ff487fcb924;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_e8,
             (chunk->super_BaseWithoutMT<njoy::ENDFtk::section::Type<2,_152>_>).atomicWeightRatio_);
  bStack_7f = Catch::Matchers::WithinRelMatcher::match
                        ((WithinRelMatcher *)local_e8,(double *)local_a8);
  local_80 = true;
  local_88 = (undefined1  [8])&PTR_streamReconstructedExpression_001d3330;
  local_78._M_head_impl._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)local_a8;
  local_70[0]._0_8_ = (WithinRelMatcher *)local_e8;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_88);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_88);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_e8);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_e8 = (undefined1  [8])0x184484;
  local_e0 = (pointer)0xf7;
  macroName_05.m_size = 5;
  macroName_05.m_start = "CHECK";
  capturedExpression_05.m_size = 0x11;
  capturedExpression_05.m_start = "1 == chunk.LSSF()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_05,(SourceLineInfo *)local_e8,capturedExpression_05,
             ContinueOnFailure);
  local_e0._1_1_ = chunk->lssf_;
  local_e0._0_1_ = true;
  local_e8 = (undefined1  [8])&PTR_streamReconstructedExpression_001d3370;
  local_e0._4_4_ = 1;
  local_d8 = "==";
  local_d0 = (undefined1  [8])0x2;
  local_c8._0_1_ = chunk->lssf_;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_e8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_e8);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_e8 = (undefined1  [8])0x184484;
  local_e0 = (pointer)0xf8;
  macroName_06.m_size = 5;
  macroName_06.m_start = "CHECK";
  capturedExpression_06.m_size = 0x1e;
  capturedExpression_06.m_start = "1 == chunk.selfShieldingOnly()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_06,(SourceLineInfo *)local_e8,capturedExpression_06,
             ContinueOnFailure);
  local_e0._1_1_ = chunk->lssf_;
  local_e0._0_1_ = true;
  local_e8 = (undefined1  [8])&PTR_streamReconstructedExpression_001d3370;
  local_e0._4_4_ = 1;
  local_d8 = "==";
  local_d0 = (undefined1  [8])0x2;
  local_c8._0_1_ = chunk->lssf_;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_e8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_e8);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_e8 = (undefined1  [8])0x184484;
  local_e0 = (pointer)0xf9;
  macroName_07.m_size = 5;
  macroName_07.m_start = "CHECK";
  capturedExpression_07.m_size = 0x1a;
  capturedExpression_07.m_start = "2 == chunk.interpolation()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_07,(SourceLineInfo *)local_e8,capturedExpression_07,
             ContinueOnFailure);
  local_e0._1_1_ = chunk->interpolation_ == 2;
  local_e0._0_1_ = true;
  local_e8 = (undefined1  [8])&PTR_streamReconstructedExpression_001d32f0;
  local_e0._4_4_ = 2;
  local_d8 = "==";
  local_d0 = (undefined1  [8])0x2;
  local_c8 = chunk->interpolation_;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_e8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_e8);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_e8 = (undefined1  [8])0x184484;
  local_e0 = (pointer)0xfb;
  macroName_08.m_size = 5;
  macroName_08.m_start = "CHECK";
  capturedExpression_08.m_size = 0x10;
  capturedExpression_08.m_start = "19 == chunk.NW()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_08,(SourceLineInfo *)local_e8,capturedExpression_08,
             ContinueOnFailure);
  local_c8 = (int)((ulong)((long)(chunk->data_).data.
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_finish -
                          (long)(chunk->data_).data.
                                super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data._M_start) >> 3);
  local_e0._1_1_ = local_c8 == 0x13;
  local_e0._0_1_ = true;
  local_e8 = (undefined1  [8])&PTR_streamReconstructedExpression_001d32f0;
  local_e0._4_4_ = 0x13;
  local_d8 = "==";
  local_d0 = (undefined1  [8])0x2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_e8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_e8);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_e8 = (undefined1  [8])0x184484;
  local_e0 = (pointer)0xfc;
  macroName_09.m_size = 5;
  macroName_09.m_start = "CHECK";
  capturedExpression_09.m_size = 0x1a;
  capturedExpression_09.m_start = "19 == chunk.numberValues()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_09,(SourceLineInfo *)local_e8,capturedExpression_09,
             ContinueOnFailure);
  local_c8 = (int)((ulong)((long)(chunk->data_).data.
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_finish -
                          (long)(chunk->data_).data.
                                super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data._M_start) >> 3);
  local_e0._1_1_ = local_c8 == 0x13;
  local_e0._0_1_ = true;
  local_e8 = (undefined1  [8])&PTR_streamReconstructedExpression_001d32f0;
  local_e0._4_4_ = 0x13;
  local_d8 = "==";
  local_d0 = (undefined1  [8])0x2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_e8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_e8);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_e8 = (undefined1  [8])0x184484;
  local_e0 = (pointer)0xfe;
  macroName_10.m_size = 5;
  macroName_10.m_start = "CHECK";
  capturedExpression_10.m_size = 0x12;
  capturedExpression_10.m_start = "5 == chunk.NREAC()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_10,(SourceLineInfo *)local_e8,capturedExpression_10,
             ContinueOnFailure);
  local_c8 = (int)(chunk->data_).metadata.fields.
                  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
                  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
                  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Head_base<2UL,_long,_false>.
                  _M_head_impl;
  local_e0._1_1_ = local_c8 == 5;
  local_e0._0_1_ = true;
  local_e8 = (undefined1  [8])&PTR_streamReconstructedExpression_001d32f0;
  local_e0._4_4_ = 5;
  local_d8 = "==";
  local_d0 = (undefined1  [8])0x2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_e8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_e8);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_e8 = (undefined1  [8])0x184484;
  local_e0 = (pointer)0xff;
  macroName_11.m_size = 5;
  macroName_11.m_start = "CHECK";
  capturedExpression_11.m_size = 0x1c;
  capturedExpression_11.m_start = "5 == chunk.numberReactions()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_11,(SourceLineInfo *)local_e8,capturedExpression_11,
             ContinueOnFailure);
  local_c8 = (int)(chunk->data_).metadata.fields.
                  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
                  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
                  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Head_base<2UL,_long,_false>.
                  _M_head_impl;
  local_e0._1_1_ = local_c8 == 5;
  local_e0._0_1_ = true;
  local_e8 = (undefined1  [8])&PTR_streamReconstructedExpression_001d32f0;
  local_e0._4_4_ = 5;
  local_d8 = "==";
  local_d0 = (undefined1  [8])0x2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_e8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_e8);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_e8 = (undefined1  [8])0x184484;
  local_e0 = (pointer)0x100;
  macroName_12.m_size = 5;
  macroName_12.m_start = "CHECK";
  capturedExpression_12.m_size = 0x12;
  capturedExpression_12.m_start = "1 == chunk.NSIGZ()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_12,(SourceLineInfo *)local_e8,capturedExpression_12,
             ContinueOnFailure);
  local_c8 = (int)((_Head_base<3UL,_long,_false> *)
                  ((long)&(chunk->data_).metadata.fields.
                          super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
                          super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
                          super__Tuple_impl<2UL,_long,_long,_long,_long>.
                          super__Tuple_impl<3UL,_long,_long,_long> + 0x10))->_M_head_impl;
  local_e0._1_1_ = local_c8 == 1;
  local_e0._0_1_ = true;
  local_e8 = (undefined1  [8])&PTR_streamReconstructedExpression_001d32f0;
  local_e0._4_4_ = 1;
  local_d8 = "==";
  local_d0 = (undefined1  [8])0x2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_e8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_e8);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_e8 = (undefined1  [8])0x184484;
  local_e0 = (pointer)0x101;
  macroName_13.m_size = 5;
  macroName_13.m_start = "CHECK";
  capturedExpression_13.m_size = 0x1c;
  capturedExpression_13.m_start = "1 == chunk.numberDilutions()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_13,(SourceLineInfo *)local_e8,capturedExpression_13,
             ContinueOnFailure);
  local_c8 = (int)((_Head_base<3UL,_long,_false> *)
                  ((long)&(chunk->data_).metadata.fields.
                          super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
                          super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
                          super__Tuple_impl<2UL,_long,_long,_long,_long>.
                          super__Tuple_impl<3UL,_long,_long,_long> + 0x10))->_M_head_impl;
  local_e0._1_1_ = local_c8 == 1;
  local_e0._0_1_ = true;
  local_e8 = (undefined1  [8])&PTR_streamReconstructedExpression_001d32f0;
  local_e0._4_4_ = 1;
  local_d8 = "==";
  local_d0 = (undefined1  [8])0x2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_e8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_e8);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_e8 = (undefined1  [8])0x184484;
  local_e0 = (pointer)0x102;
  macroName_14.m_size = 5;
  macroName_14.m_start = "CHECK";
  capturedExpression_14.m_size = 0x11;
  capturedExpression_14.m_start = "3 == chunk.NUNR()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_14,(SourceLineInfo *)local_e8,capturedExpression_14,
             ContinueOnFailure);
  local_c8 = *(int *)&(chunk->data_).metadata.fields.
                      super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
                      super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
                      super__Tuple_impl<2UL,_long,_long,_long,_long>.
                      super__Tuple_impl<3UL,_long,_long,_long>.super__Tuple_impl<4UL,_long,_long>;
  local_e0._1_1_ = local_c8 == 3;
  local_e0._0_1_ = true;
  local_e8 = (undefined1  [8])&PTR_streamReconstructedExpression_001d32f0;
  local_e0._4_4_ = 3;
  local_d8 = "==";
  local_d0 = (undefined1  [8])0x2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_e8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_e8);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_e8 = (undefined1  [8])0x184484;
  local_e0 = (pointer)0x103;
  macroName_15.m_size = 5;
  macroName_15.m_start = "CHECK";
  capturedExpression_15.m_size = 0x1b;
  capturedExpression_15.m_start = "3 == chunk.numberEnergies()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_15,(SourceLineInfo *)local_e8,capturedExpression_15,
             ContinueOnFailure);
  local_c8 = *(int *)&(chunk->data_).metadata.fields.
                      super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
                      super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
                      super__Tuple_impl<2UL,_long,_long,_long,_long>.
                      super__Tuple_impl<3UL,_long,_long,_long>.super__Tuple_impl<4UL,_long,_long>;
  local_e0._1_1_ = local_c8 == 3;
  local_e0._0_1_ = true;
  local_e8 = (undefined1  [8])&PTR_streamReconstructedExpression_001d32f0;
  local_e0._4_4_ = 3;
  local_d8 = "==";
  local_d0 = (undefined1  [8])0x2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_e8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_e8);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_e8 = (undefined1  [8])0x184484;
  local_e0 = (pointer)0x105;
  macroName_16.m_size = 10;
  macroName_16.m_start = "CHECK_THAT";
  capturedExpression_16.m_size = 0x1d;
  capturedExpression_16.m_start = "0., WithinRel( chunk.TEMZ() )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_16,(SourceLineInfo *)local_e8,capturedExpression_16,
             ContinueOnFailure);
  local_a8 = (undefined1  [8])0x0;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_e8,
             (chunk->data_).metadata.fields.
             super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
             super__Head_base<0UL,_double,_false>._M_head_impl);
  bStack_7f = Catch::Matchers::WithinRelMatcher::match
                        ((WithinRelMatcher *)local_e8,(double *)local_a8);
  local_80 = true;
  local_88 = (undefined1  [8])&PTR_streamReconstructedExpression_001d3330;
  local_78._M_head_impl._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)local_a8;
  local_70[0]._0_8_ = (WithinRelMatcher *)local_e8;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_88);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_88);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_e8);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_e8 = (undefined1  [8])0x184484;
  local_e0 = (pointer)0x106;
  macroName_17.m_size = 10;
  macroName_17.m_start = "CHECK_THAT";
  capturedExpression_17.m_size = 0x24;
  capturedExpression_17.m_start = "0., WithinRel( chunk.temperature() )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_17,(SourceLineInfo *)local_e8,capturedExpression_17,
             ContinueOnFailure);
  local_a8 = (undefined1  [8])0x0;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_e8,
             (chunk->data_).metadata.fields.
             super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
             super__Head_base<0UL,_double,_false>._M_head_impl);
  bStack_7f = Catch::Matchers::WithinRelMatcher::match
                        ((WithinRelMatcher *)local_e8,(double *)local_a8);
  local_80 = true;
  local_88 = (undefined1  [8])&PTR_streamReconstructedExpression_001d3330;
  local_78._M_head_impl._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)local_a8;
  local_70[0]._0_8_ = (WithinRelMatcher *)local_e8;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_88);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_88);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_e8);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_e8 = (undefined1  [8])0x184484;
  local_e0 = (pointer)0x108;
  macroName_18.m_size = 5;
  macroName_18.m_start = "CHECK";
  capturedExpression_18.m_size = 0x18;
  capturedExpression_18.m_start = "1 == chunk.SIGZ().size()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_18,(SourceLineInfo *)local_e8,capturedExpression_18,
             ContinueOnFailure);
  uVar2 = ((_Head_base<3UL,_long,_false> *)
          ((long)&(chunk->data_).metadata.fields.
                  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
                  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
                  super__Tuple_impl<2UL,_long,_long,_long,_long>.
                  super__Tuple_impl<3UL,_long,_long,_long> + 0x10))->_M_head_impl;
  local_e0._1_1_ = (uVar2 & 0xffffffff) == 1;
  local_e0._0_1_ = true;
  _local_c8 = SEXT48((int)uVar2);
  local_e8 = (undefined1  [8])&PTR_streamReconstructedExpression_001d33b0;
  local_e0._4_4_ = 1;
  local_d8 = "==";
  local_d0 = (undefined1  [8])0x2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_e8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_e8);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_e8 = (undefined1  [8])0x184484;
  local_e0 = (pointer)0x109;
  macroName_19.m_size = 5;
  macroName_19.m_start = "CHECK";
  capturedExpression_19.m_size = 0x1d;
  capturedExpression_19.m_start = "1 == chunk.dilutions().size()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_19,(SourceLineInfo *)local_e8,capturedExpression_19,
             ContinueOnFailure);
  uVar2 = ((_Head_base<3UL,_long,_false> *)
          ((long)&(chunk->data_).metadata.fields.
                  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
                  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
                  super__Tuple_impl<2UL,_long,_long,_long,_long>.
                  super__Tuple_impl<3UL,_long,_long,_long> + 0x10))->_M_head_impl;
  _local_c8 = SEXT48((int)uVar2);
  local_e0._1_1_ = (uVar2 & 0xffffffff) == 1;
  local_e0._0_1_ = true;
  local_e8 = (undefined1  [8])&PTR_streamReconstructedExpression_001d33b0;
  local_e0._4_4_ = 1;
  local_d8 = "==";
  local_d0 = (undefined1  [8])0x2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_e8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_e8);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_e8 = (undefined1  [8])0x184484;
  local_e0 = (pointer)0x10a;
  macroName_20.m_size = 10;
  macroName_20.m_start = "CHECK_THAT";
  capturedExpression_20.m_size = 0x23;
  capturedExpression_20.m_start = "1e+10, WithinRel( chunk.SIGZ()[0] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_20,(SourceLineInfo *)local_e8,capturedExpression_20,
             ContinueOnFailure);
  local_a8 = (undefined1  [8])0x4202a05f20000000;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_e8,
             *(chunk->data_).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start);
  bStack_7f = Catch::Matchers::WithinRelMatcher::match
                        ((WithinRelMatcher *)local_e8,(double *)local_a8);
  local_80 = true;
  local_88 = (undefined1  [8])&PTR_streamReconstructedExpression_001d3330;
  local_78._M_head_impl._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)local_a8;
  local_70[0]._0_8_ = (WithinRelMatcher *)local_e8;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_88);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_88);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_e8);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_e8 = (undefined1  [8])0x184484;
  local_e0 = (pointer)0x10b;
  macroName_21.m_size = 10;
  macroName_21.m_start = "CHECK_THAT";
  capturedExpression_21.m_size = 0x28;
  capturedExpression_21.m_start = "1e+10, WithinRel( chunk.dilutions()[0] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_21,(SourceLineInfo *)local_e8,capturedExpression_21,
             ContinueOnFailure);
  local_a8 = (undefined1  [8])0x4202a05f20000000;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_e8,
             *(chunk->data_).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start);
  bStack_7f = Catch::Matchers::WithinRelMatcher::match
                        ((WithinRelMatcher *)local_e8,(double *)local_a8);
  local_80 = true;
  local_88 = (undefined1  [8])&PTR_streamReconstructedExpression_001d3330;
  local_78._M_head_impl._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)local_a8;
  local_70[0]._0_8_ = (WithinRelMatcher *)local_e8;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_88);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_88);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_e8);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_e8 = (undefined1  [8])0x184484;
  local_e0 = (pointer)0x10d;
  macroName_22.m_size = 5;
  macroName_22.m_start = "CHECK";
  capturedExpression_22.m_size = 0x18;
  capturedExpression_22.m_start = "3 == chunk.EUNR().size()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_22,(SourceLineInfo *)local_e8,capturedExpression_22,
             ContinueOnFailure);
  njoy::ENDFtk::section::Type<2,_152>::EUNR
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_int>
              *)local_88,chunk);
  _local_c8 = (((CONCAT44(uStack_7c,CONCAT22(uStack_7e,CONCAT11(bStack_7f,local_80))) -
                 (long)local_78._M_head_impl._M_current >> 3) + local_70[0]._M_allocated_capacity) -
              1U) / (ulong)local_70[0]._0_8_;
  local_e0._1_1_ = _local_c8 == 3;
  local_e0._0_1_ = true;
  local_e8 = (undefined1  [8])&PTR_streamReconstructedExpression_001d33b0;
  local_e0._4_4_ = 3;
  local_d8 = "==";
  local_d0 = (undefined1  [8])0x2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_e8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_e8);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_e8 = (undefined1  [8])0x184484;
  local_e0 = (pointer)0x10e;
  macroName_23.m_size = 5;
  macroName_23.m_start = "CHECK";
  capturedExpression_23.m_size = 0x1c;
  capturedExpression_23.m_start = "3 == chunk.energies().size()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_23,(SourceLineInfo *)local_e8,capturedExpression_23,
             ContinueOnFailure);
  njoy::ENDFtk::section::Type<2,_152>::EUNR
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_int>
              *)local_88,chunk);
  _local_c8 = (((CONCAT44(uStack_7c,CONCAT22(uStack_7e,CONCAT11(bStack_7f,local_80))) -
                 (long)local_78._M_head_impl._M_current >> 3) + local_70[0]._M_allocated_capacity) -
              1U) / (ulong)local_70[0]._0_8_;
  local_e0._1_1_ = _local_c8 == 3;
  local_e0._0_1_ = true;
  local_e8 = (undefined1  [8])&PTR_streamReconstructedExpression_001d33b0;
  local_e0._4_4_ = 3;
  local_d8 = "==";
  local_d0 = (undefined1  [8])0x2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_e8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_e8);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_e8 = (undefined1  [8])0x184484;
  local_e0 = (pointer)0x10f;
  macroName_24.m_size = 10;
  macroName_24.m_start = "CHECK_THAT";
  capturedExpression_24.m_size = 0x23;
  capturedExpression_24.m_start = "2500., WithinRel( chunk.EUNR()[0] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_24,(SourceLineInfo *)local_e8,capturedExpression_24,
             ContinueOnFailure);
  local_50._0_8_ = 0x40a3880000000000;
  njoy::ENDFtk::section::Type<2,_152>::EUNR
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_int>
              *)local_88,chunk);
  pdVar1 = ranges::
           view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)-1>
           ::operator[]<true,_true,_0,_0>
                     ((view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)_1>
                       *)local_88,0);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_e8,*pdVar1);
  bStack_9f = Catch::Matchers::WithinRelMatcher::match
                        ((WithinRelMatcher *)local_e8,(double *)&local_50);
  local_a0 = true;
  local_a8 = (undefined1  [8])&PTR_streamReconstructedExpression_001d3330;
  local_98._M_current = (double *)&local_50;
  local_90 = (WithinRelMatcher *)local_e8;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_a8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_a8);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_e8);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_e8 = (undefined1  [8])0x184484;
  local_e0 = (pointer)0x110;
  macroName_25.m_size = 10;
  macroName_25.m_start = "CHECK_THAT";
  capturedExpression_25.m_size = 0x23;
  capturedExpression_25.m_start = "2550., WithinRel( chunk.EUNR()[1] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_25,(SourceLineInfo *)local_e8,capturedExpression_25,
             ContinueOnFailure);
  local_50._0_8_ = 0x40a3ec0000000000;
  njoy::ENDFtk::section::Type<2,_152>::EUNR
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_int>
              *)local_88,chunk);
  pdVar1 = ranges::
           view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)-1>
           ::operator[]<true,_true,_0,_0>
                     ((view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)_1>
                       *)local_88,1);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_e8,*pdVar1);
  bStack_9f = Catch::Matchers::WithinRelMatcher::match
                        ((WithinRelMatcher *)local_e8,(double *)&local_50);
  local_a0 = true;
  local_a8 = (undefined1  [8])&PTR_streamReconstructedExpression_001d3330;
  local_98._M_current = (double *)&local_50;
  local_90 = (WithinRelMatcher *)local_e8;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_a8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_a8);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_e8);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_e8 = (undefined1  [8])0x184484;
  local_e0 = (pointer)0x111;
  macroName_26.m_size = 10;
  macroName_26.m_start = "CHECK_THAT";
  capturedExpression_26.m_size = 0x24;
  capturedExpression_26.m_start = "30000., WithinRel( chunk.EUNR()[2] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_26,(SourceLineInfo *)local_e8,capturedExpression_26,
             ContinueOnFailure);
  local_50._0_8_ = 0x40dd4c0000000000;
  njoy::ENDFtk::section::Type<2,_152>::EUNR
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_int>
              *)local_88,chunk);
  pdVar1 = ranges::
           view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)-1>
           ::operator[]<true,_true,_0,_0>
                     ((view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)_1>
                       *)local_88,2);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_e8,*pdVar1);
  bStack_9f = Catch::Matchers::WithinRelMatcher::match
                        ((WithinRelMatcher *)local_e8,(double *)&local_50);
  local_a0 = true;
  local_a8 = (undefined1  [8])&PTR_streamReconstructedExpression_001d3330;
  local_98._M_current = (double *)&local_50;
  local_90 = (WithinRelMatcher *)local_e8;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_a8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_a8);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_e8);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_e8 = (undefined1  [8])0x184484;
  local_e0 = (pointer)0x112;
  macroName_27.m_size = 10;
  macroName_27.m_start = "CHECK_THAT";
  capturedExpression_27.m_size = 0x27;
  capturedExpression_27.m_start = "2500., WithinRel( chunk.energies()[0] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_27,(SourceLineInfo *)local_e8,capturedExpression_27,
             ContinueOnFailure);
  local_50._0_8_ = 0x40a3880000000000;
  njoy::ENDFtk::section::Type<2,_152>::EUNR
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_int>
              *)local_88,chunk);
  pdVar1 = ranges::
           view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)-1>
           ::operator[]<true,_true,_0,_0>
                     ((view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)_1>
                       *)local_88,0);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_e8,*pdVar1);
  bStack_9f = Catch::Matchers::WithinRelMatcher::match
                        ((WithinRelMatcher *)local_e8,(double *)&local_50);
  local_a0 = true;
  local_a8 = (undefined1  [8])&PTR_streamReconstructedExpression_001d3330;
  local_98._M_current = (double *)&local_50;
  local_90 = (WithinRelMatcher *)local_e8;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_a8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_a8);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_e8);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_e8 = (undefined1  [8])0x184484;
  local_e0 = (pointer)0x113;
  macroName_28.m_size = 10;
  macroName_28.m_start = "CHECK_THAT";
  capturedExpression_28.m_size = 0x27;
  capturedExpression_28.m_start = "2550., WithinRel( chunk.energies()[1] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_28,(SourceLineInfo *)local_e8,capturedExpression_28,
             ContinueOnFailure);
  local_50._0_8_ = 0x40a3ec0000000000;
  njoy::ENDFtk::section::Type<2,_152>::EUNR
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_int>
              *)local_88,chunk);
  pdVar1 = ranges::
           view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)-1>
           ::operator[]<true,_true,_0,_0>
                     ((view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)_1>
                       *)local_88,1);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_e8,*pdVar1);
  bStack_9f = Catch::Matchers::WithinRelMatcher::match
                        ((WithinRelMatcher *)local_e8,(double *)&local_50);
  local_a0 = true;
  local_a8 = (undefined1  [8])&PTR_streamReconstructedExpression_001d3330;
  local_98._M_current = (double *)&local_50;
  local_90 = (WithinRelMatcher *)local_e8;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_a8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_a8);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_e8);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_e8 = (undefined1  [8])0x184484;
  local_e0 = (pointer)0x114;
  macroName_29.m_size = 10;
  macroName_29.m_start = "CHECK_THAT";
  capturedExpression_29.m_size = 0x28;
  capturedExpression_29.m_start = "30000., WithinRel( chunk.energies()[2] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_29,(SourceLineInfo *)local_e8,capturedExpression_29,
             ContinueOnFailure);
  local_50._0_8_ = 0x40dd4c0000000000;
  njoy::ENDFtk::section::Type<2,_152>::EUNR
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_int>
              *)local_88,chunk);
  pdVar1 = ranges::
           view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)-1>
           ::operator[]<true,_true,_0,_0>
                     ((view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)_1>
                       *)local_88,2);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_e8,*pdVar1);
  bStack_9f = Catch::Matchers::WithinRelMatcher::match
                        ((WithinRelMatcher *)local_e8,(double *)&local_50);
  local_a0 = true;
  local_a8 = (undefined1  [8])&PTR_streamReconstructedExpression_001d3330;
  local_98._M_current = (double *)&local_50;
  local_90 = (WithinRelMatcher *)local_e8;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_a8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_a8);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_e8);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_e8 = (undefined1  [8])0x184484;
  local_e0 = (pointer)0x116;
  macroName_30.m_size = 5;
  macroName_30.m_start = "CHECK";
  capturedExpression_30.m_size = 0x19;
  capturedExpression_30.m_start = "3 == chunk.total().size()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_30,(SourceLineInfo *)local_e8,capturedExpression_30,
             ContinueOnFailure);
  njoy::ENDFtk::section::Type<2,_152>::total
            ((invoke_result_t<ranges::views::transform_base_fn,_ranges::transform_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_2_152_src_reaction_hpp:9:23)>_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_2_152_src_reaction_hpp:14:23)>
              *)local_e8,chunk);
  uVar2 = (long)local_d0 - _local_c8 >> 3;
  local_70[0]._8_8_ = (uVar2 / (ulong)local_c0 + 1) - (ulong)(uVar2 % (ulong)local_c0 == 0);
  bStack_7f = local_70[0]._8_8_ == 3;
  local_80 = true;
  local_88 = (undefined1  [8])&PTR_streamReconstructedExpression_001d33b0;
  uStack_7c = 3;
  local_78._M_head_impl._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (double *)0x185df5;
  local_70[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_88);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_88);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_e8 = (undefined1  [8])0x184484;
  local_e0 = (pointer)0x117;
  macroName_31.m_size = 5;
  macroName_31.m_start = "CHECK";
  capturedExpression_31.m_size = 0x1b;
  capturedExpression_31.m_start = "3 == chunk.elastic().size()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_31,(SourceLineInfo *)local_e8,capturedExpression_31,
             ContinueOnFailure);
  njoy::ENDFtk::section::Type<2,_152>::elastic
            ((invoke_result_t<ranges::views::transform_base_fn,_ranges::transform_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_2_152_src_reaction_hpp:9:23)>_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_2_152_src_reaction_hpp:14:23)>
              *)local_e8,chunk);
  uVar2 = (long)local_d0 - _local_c8 >> 3;
  local_70[0]._8_8_ = (uVar2 / (ulong)local_c0 + 1) - (ulong)(uVar2 % (ulong)local_c0 == 0);
  bStack_7f = local_70[0]._8_8_ == 3;
  local_80 = true;
  local_88 = (undefined1  [8])&PTR_streamReconstructedExpression_001d33b0;
  uStack_7c = 3;
  local_78._M_head_impl._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (double *)0x185df5;
  local_70[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_88);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_88);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_e8 = (undefined1  [8])0x184484;
  local_e0 = (pointer)0x118;
  macroName_32.m_size = 5;
  macroName_32.m_start = "CHECK";
  capturedExpression_32.m_size = 0x1b;
  capturedExpression_32.m_start = "3 == chunk.fission().size()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_32,(SourceLineInfo *)local_e8,capturedExpression_32,
             ContinueOnFailure);
  njoy::ENDFtk::section::Type<2,_152>::fission
            ((invoke_result_t<ranges::views::transform_base_fn,_ranges::transform_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_2_152_src_reaction_hpp:9:23)>_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_2_152_src_reaction_hpp:14:23)>
              *)local_e8,chunk);
  uVar2 = (long)local_d0 - _local_c8 >> 3;
  local_70[0]._8_8_ = (uVar2 / (ulong)local_c0 + 1) - (ulong)(uVar2 % (ulong)local_c0 == 0);
  bStack_7f = local_70[0]._8_8_ == 3;
  local_80 = true;
  local_88 = (undefined1  [8])&PTR_streamReconstructedExpression_001d33b0;
  uStack_7c = 3;
  local_78._M_head_impl._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (double *)0x185df5;
  local_70[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_88);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_88);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_e8 = (undefined1  [8])0x184484;
  local_e0 = (pointer)0x119;
  macroName_33.m_size = 5;
  macroName_33.m_start = "CHECK";
  capturedExpression_33.m_size = 0x1b;
  capturedExpression_33.m_start = "3 == chunk.capture().size()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_33,(SourceLineInfo *)local_e8,capturedExpression_33,
             ContinueOnFailure);
  njoy::ENDFtk::section::Type<2,_152>::capture
            ((invoke_result_t<ranges::views::transform_base_fn,_ranges::transform_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_2_152_src_reaction_hpp:9:23)>_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_2_152_src_reaction_hpp:14:23)>
              *)local_e8,chunk);
  uVar2 = (long)local_d0 - _local_c8 >> 3;
  local_70[0]._8_8_ = (uVar2 / (ulong)local_c0 + 1) - (ulong)(uVar2 % (ulong)local_c0 == 0);
  bStack_7f = local_70[0]._8_8_ == 3;
  local_80 = true;
  local_88 = (undefined1  [8])&PTR_streamReconstructedExpression_001d33b0;
  uStack_7c = 3;
  local_78._M_head_impl._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (double *)0x185df5;
  local_70[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_88);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_88);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_e8 = (undefined1  [8])0x184484;
  local_e0 = (pointer)0x11a;
  macroName_34.m_size = 5;
  macroName_34.m_start = "CHECK";
  capturedExpression_34.m_size = 0x28;
  capturedExpression_34.m_start = "3 == chunk.currentWeightedTotal().size()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_34,(SourceLineInfo *)local_e8,capturedExpression_34,
             ContinueOnFailure);
  njoy::ENDFtk::section::Type<2,_152>::currentWeightedTotal
            ((invoke_result_t<ranges::views::transform_base_fn,_ranges::transform_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_2_152_src_reaction_hpp:9:23)>_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_2_152_src_reaction_hpp:14:23)>
              *)local_e8,chunk);
  uVar2 = (long)local_d0 - _local_c8 >> 3;
  local_70[0]._8_8_ = (uVar2 / (ulong)local_c0 + 1) - (ulong)(uVar2 % (ulong)local_c0 == 0);
  bStack_7f = local_70[0]._8_8_ == 3;
  local_80 = true;
  local_88 = (undefined1  [8])&PTR_streamReconstructedExpression_001d33b0;
  uStack_7c = 3;
  local_78._M_head_impl._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (double *)0x185df5;
  local_70[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_88);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_88);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_e8 = (undefined1  [8])0x184484;
  local_e0 = (pointer)0x11b;
  macroName_35.m_size = 5;
  macroName_35.m_start = "CHECK";
  capturedExpression_35.m_size = 0x1c;
  capturedExpression_35.m_start = "1 == chunk.total()[0].size()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_35,(SourceLineInfo *)local_e8,capturedExpression_35,
             ContinueOnFailure);
  njoy::ENDFtk::section::Type<2,_152>::total
            ((invoke_result_t<ranges::views::transform_base_fn,_ranges::transform_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_2_152_src_reaction_hpp:9:23)>_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_2_152_src_reaction_hpp:14:23)>
              *)local_e8,chunk);
  ranges::
  view_interface<ranges::iter_transform_view<ranges::transform_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/2/152/src/reaction.hpp:9:23)>,_ranges::indirected<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/2/152/src/reaction.hpp:14:23)>_>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            ((range_reference_t<D<true>_>_conflict *)local_a8,
             (view_interface<ranges::iter_transform_view<ranges::transform_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_2_152_src_reaction_hpp:9:23)>,_ranges::indirected<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_2_152_src_reaction_hpp:14:23)>_>,_(ranges::cardinality)_1>
              *)local_e8,0);
  local_70[0]._8_8_ =
       CONCAT62(uStack_9e,CONCAT11(bStack_9f,local_a0)) - (long)local_98._M_current >> 3;
  if (local_90 < (ulong)local_70[0]._8_8_) {
    local_70[0]._8_8_ = local_90;
  }
  bStack_7f = (WithinRelMatcher *)local_70[0]._8_8_ == (WithinRelMatcher *)0x1;
  local_80 = true;
  local_88 = (undefined1  [8])&PTR_streamReconstructedExpression_001d33b0;
  uStack_7c = 1;
  local_78._M_head_impl._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (double *)0x185df5;
  local_70[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_88);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_88);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_e8 = (undefined1  [8])0x184484;
  local_e0 = (pointer)0x11c;
  macroName_36.m_size = 5;
  macroName_36.m_start = "CHECK";
  capturedExpression_36.m_size = 0x1e;
  capturedExpression_36.m_start = "1 == chunk.elastic()[0].size()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_36,(SourceLineInfo *)local_e8,capturedExpression_36,
             ContinueOnFailure);
  njoy::ENDFtk::section::Type<2,_152>::elastic
            ((invoke_result_t<ranges::views::transform_base_fn,_ranges::transform_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_2_152_src_reaction_hpp:9:23)>_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_2_152_src_reaction_hpp:14:23)>
              *)local_e8,chunk);
  ranges::
  view_interface<ranges::iter_transform_view<ranges::transform_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/2/152/src/reaction.hpp:9:23)>,_ranges::indirected<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/2/152/src/reaction.hpp:14:23)>_>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            ((range_reference_t<D<true>_>_conflict *)local_a8,
             (view_interface<ranges::iter_transform_view<ranges::transform_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_2_152_src_reaction_hpp:9:23)>,_ranges::indirected<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_2_152_src_reaction_hpp:14:23)>_>,_(ranges::cardinality)_1>
              *)local_e8,0);
  local_70[0]._8_8_ =
       CONCAT62(uStack_9e,CONCAT11(bStack_9f,local_a0)) - (long)local_98._M_current >> 3;
  if (local_90 < (ulong)local_70[0]._8_8_) {
    local_70[0]._8_8_ = local_90;
  }
  bStack_7f = (WithinRelMatcher *)local_70[0]._8_8_ == (WithinRelMatcher *)0x1;
  local_80 = true;
  local_88 = (undefined1  [8])&PTR_streamReconstructedExpression_001d33b0;
  uStack_7c = 1;
  local_78._M_head_impl._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (double *)0x185df5;
  local_70[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_88);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_88);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_e8 = (undefined1  [8])0x184484;
  local_e0 = (pointer)0x11d;
  macroName_37.m_size = 5;
  macroName_37.m_start = "CHECK";
  capturedExpression_37.m_size = 0x1e;
  capturedExpression_37.m_start = "1 == chunk.fission()[0].size()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_37,(SourceLineInfo *)local_e8,capturedExpression_37,
             ContinueOnFailure);
  njoy::ENDFtk::section::Type<2,_152>::fission
            ((invoke_result_t<ranges::views::transform_base_fn,_ranges::transform_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_2_152_src_reaction_hpp:9:23)>_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_2_152_src_reaction_hpp:14:23)>
              *)local_e8,chunk);
  ranges::
  view_interface<ranges::iter_transform_view<ranges::transform_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/2/152/src/reaction.hpp:9:23)>,_ranges::indirected<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/2/152/src/reaction.hpp:14:23)>_>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            ((range_reference_t<D<true>_>_conflict *)local_a8,
             (view_interface<ranges::iter_transform_view<ranges::transform_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_2_152_src_reaction_hpp:9:23)>,_ranges::indirected<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_2_152_src_reaction_hpp:14:23)>_>,_(ranges::cardinality)_1>
              *)local_e8,0);
  local_70[0]._8_8_ =
       CONCAT62(uStack_9e,CONCAT11(bStack_9f,local_a0)) - (long)local_98._M_current >> 3;
  if (local_90 < (ulong)local_70[0]._8_8_) {
    local_70[0]._8_8_ = local_90;
  }
  bStack_7f = (WithinRelMatcher *)local_70[0]._8_8_ == (WithinRelMatcher *)0x1;
  local_80 = true;
  local_88 = (undefined1  [8])&PTR_streamReconstructedExpression_001d33b0;
  uStack_7c = 1;
  local_78._M_head_impl._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (double *)0x185df5;
  local_70[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_88);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_88);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_e8 = (undefined1  [8])0x184484;
  local_e0 = (pointer)0x11e;
  macroName_38.m_size = 5;
  macroName_38.m_start = "CHECK";
  capturedExpression_38.m_size = 0x1e;
  capturedExpression_38.m_start = "1 == chunk.capture()[0].size()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_38,(SourceLineInfo *)local_e8,capturedExpression_38,
             ContinueOnFailure);
  njoy::ENDFtk::section::Type<2,_152>::capture
            ((invoke_result_t<ranges::views::transform_base_fn,_ranges::transform_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_2_152_src_reaction_hpp:9:23)>_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_2_152_src_reaction_hpp:14:23)>
              *)local_e8,chunk);
  ranges::
  view_interface<ranges::iter_transform_view<ranges::transform_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/2/152/src/reaction.hpp:9:23)>,_ranges::indirected<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/2/152/src/reaction.hpp:14:23)>_>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            ((range_reference_t<D<true>_>_conflict *)local_a8,
             (view_interface<ranges::iter_transform_view<ranges::transform_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_2_152_src_reaction_hpp:9:23)>,_ranges::indirected<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_2_152_src_reaction_hpp:14:23)>_>,_(ranges::cardinality)_1>
              *)local_e8,0);
  local_70[0]._8_8_ =
       CONCAT62(uStack_9e,CONCAT11(bStack_9f,local_a0)) - (long)local_98._M_current >> 3;
  if (local_90 < (ulong)local_70[0]._8_8_) {
    local_70[0]._8_8_ = local_90;
  }
  bStack_7f = (WithinRelMatcher *)local_70[0]._8_8_ == (WithinRelMatcher *)0x1;
  local_80 = true;
  local_88 = (undefined1  [8])&PTR_streamReconstructedExpression_001d33b0;
  uStack_7c = 1;
  local_78._M_head_impl._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (double *)0x185df5;
  local_70[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_88);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_88);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_e8 = (undefined1  [8])0x184484;
  local_e0 = (pointer)0x11f;
  macroName_39.m_size = 5;
  macroName_39.m_start = "CHECK";
  capturedExpression_39.m_size = 0x2b;
  capturedExpression_39.m_start = "1 == chunk.currentWeightedTotal()[0].size()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_39,(SourceLineInfo *)local_e8,capturedExpression_39,
             ContinueOnFailure);
  njoy::ENDFtk::section::Type<2,_152>::currentWeightedTotal
            ((invoke_result_t<ranges::views::transform_base_fn,_ranges::transform_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_2_152_src_reaction_hpp:9:23)>_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_2_152_src_reaction_hpp:14:23)>
              *)local_e8,chunk);
  ranges::
  view_interface<ranges::iter_transform_view<ranges::transform_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/2/152/src/reaction.hpp:9:23)>,_ranges::indirected<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/2/152/src/reaction.hpp:14:23)>_>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            ((range_reference_t<D<true>_>_conflict *)local_a8,
             (view_interface<ranges::iter_transform_view<ranges::transform_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_2_152_src_reaction_hpp:9:23)>,_ranges::indirected<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_2_152_src_reaction_hpp:14:23)>_>,_(ranges::cardinality)_1>
              *)local_e8,0);
  local_70[0]._8_8_ =
       CONCAT62(uStack_9e,CONCAT11(bStack_9f,local_a0)) - (long)local_98._M_current >> 3;
  if (local_90 < (ulong)local_70[0]._8_8_) {
    local_70[0]._8_8_ = local_90;
  }
  bStack_7f = (WithinRelMatcher *)local_70[0]._8_8_ == (WithinRelMatcher *)0x1;
  local_80 = true;
  local_88 = (undefined1  [8])&PTR_streamReconstructedExpression_001d33b0;
  uStack_7c = 1;
  local_78._M_head_impl._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (double *)0x185df5;
  local_70[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_88);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_88);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_e8 = (undefined1  [8])0x184484;
  local_e0 = (pointer)0x120;
  macroName_40.m_size = 10;
  macroName_40.m_start = "CHECK_THAT";
  capturedExpression_40.m_size = 0x2d;
  capturedExpression_40.m_start = "2.009120e+1, WithinRel( chunk.total()[0][0] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_40,(SourceLineInfo *)local_e8,capturedExpression_40,
             ContinueOnFailure);
  local_f0 = 0x40341758e219652c;
  njoy::ENDFtk::section::Type<2,_152>::total
            ((invoke_result_t<ranges::views::transform_base_fn,_ranges::transform_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_2_152_src_reaction_hpp:9:23)>_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_2_152_src_reaction_hpp:14:23)>
              *)local_e8,chunk);
  ranges::
  view_interface<ranges::iter_transform_view<ranges::transform_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/2/152/src/reaction.hpp:9:23)>,_ranges::indirected<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/2/152/src/reaction.hpp:14:23)>_>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            (&local_50,
             (view_interface<ranges::iter_transform_view<ranges::transform_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_2_152_src_reaction_hpp:9:23)>,_ranges::indirected<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_2_152_src_reaction_hpp:14:23)>_>,_(ranges::cardinality)_1>
              *)local_e8,0);
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_88,
             *(double *)
              local_50.base_.data_.
              super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>_>
              .
              super__Head_base<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_false>
              ._M_head_impl._M_current);
  bStack_9f = Catch::Matchers::WithinRelMatcher::match
                        ((WithinRelMatcher *)local_88,(double *)&local_f0);
  local_a0 = true;
  local_a8 = (undefined1  [8])&PTR_streamReconstructedExpression_001d3330;
  local_98._M_current = (double *)&local_f0;
  local_90 = (WithinRelMatcher *)local_88;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_a8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_a8);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_88);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_e8 = (undefined1  [8])0x184484;
  local_e0 = (pointer)0x121;
  macroName_41.m_size = 10;
  macroName_41.m_start = "CHECK_THAT";
  capturedExpression_41.m_size = 0x2d;
  capturedExpression_41.m_start = "1.923568e+1, WithinRel( chunk.total()[1][0] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_41,(SourceLineInfo *)local_e8,capturedExpression_41,
             ContinueOnFailure);
  local_f0 = 0x40333c558644523f;
  njoy::ENDFtk::section::Type<2,_152>::total
            ((invoke_result_t<ranges::views::transform_base_fn,_ranges::transform_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_2_152_src_reaction_hpp:9:23)>_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_2_152_src_reaction_hpp:14:23)>
              *)local_e8,chunk);
  ranges::
  view_interface<ranges::iter_transform_view<ranges::transform_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/2/152/src/reaction.hpp:9:23)>,_ranges::indirected<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/2/152/src/reaction.hpp:14:23)>_>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            (&local_50,
             (view_interface<ranges::iter_transform_view<ranges::transform_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_2_152_src_reaction_hpp:9:23)>,_ranges::indirected<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_2_152_src_reaction_hpp:14:23)>_>,_(ranges::cardinality)_1>
              *)local_e8,1);
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_88,
             *(double *)
              local_50.base_.data_.
              super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>_>
              .
              super__Head_base<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_false>
              ._M_head_impl._M_current);
  bStack_9f = Catch::Matchers::WithinRelMatcher::match
                        ((WithinRelMatcher *)local_88,(double *)&local_f0);
  local_a0 = true;
  local_a8 = (undefined1  [8])&PTR_streamReconstructedExpression_001d3330;
  local_98._M_current = (double *)&local_f0;
  local_90 = (WithinRelMatcher *)local_88;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_a8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_a8);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_88);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_e8 = (undefined1  [8])0x184484;
  local_e0 = (pointer)0x122;
  macroName_42.m_size = 10;
  macroName_42.m_start = "CHECK_THAT";
  capturedExpression_42.m_size = 0x2d;
  capturedExpression_42.m_start = "1.366039e+1, WithinRel( chunk.total()[2][0] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_42,(SourceLineInfo *)local_e8,capturedExpression_42,
             ContinueOnFailure);
  local_f0 = 0x402b521ea35935fc;
  njoy::ENDFtk::section::Type<2,_152>::total
            ((invoke_result_t<ranges::views::transform_base_fn,_ranges::transform_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_2_152_src_reaction_hpp:9:23)>_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_2_152_src_reaction_hpp:14:23)>
              *)local_e8,chunk);
  ranges::
  view_interface<ranges::iter_transform_view<ranges::transform_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/2/152/src/reaction.hpp:9:23)>,_ranges::indirected<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/2/152/src/reaction.hpp:14:23)>_>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            (&local_50,
             (view_interface<ranges::iter_transform_view<ranges::transform_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_2_152_src_reaction_hpp:9:23)>,_ranges::indirected<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_2_152_src_reaction_hpp:14:23)>_>,_(ranges::cardinality)_1>
              *)local_e8,2);
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_88,
             *(double *)
              local_50.base_.data_.
              super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>_>
              .
              super__Head_base<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_false>
              ._M_head_impl._M_current);
  bStack_9f = Catch::Matchers::WithinRelMatcher::match
                        ((WithinRelMatcher *)local_88,(double *)&local_f0);
  local_a0 = true;
  local_a8 = (undefined1  [8])&PTR_streamReconstructedExpression_001d3330;
  local_98._M_current = (double *)&local_f0;
  local_90 = (WithinRelMatcher *)local_88;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_a8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_a8);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_88);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_e8 = (undefined1  [8])0x184484;
  local_e0 = (pointer)0x123;
  macroName_43.m_size = 10;
  macroName_43.m_start = "CHECK_THAT";
  capturedExpression_43.m_size = 0x2f;
  capturedExpression_43.m_start = "1.343187e+1, WithinRel( chunk.elastic()[0][0] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_43,(SourceLineInfo *)local_e8,capturedExpression_43,
             ContinueOnFailure);
  local_f0 = 0x402add1e108c3f3e;
  njoy::ENDFtk::section::Type<2,_152>::elastic
            ((invoke_result_t<ranges::views::transform_base_fn,_ranges::transform_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_2_152_src_reaction_hpp:9:23)>_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_2_152_src_reaction_hpp:14:23)>
              *)local_e8,chunk);
  ranges::
  view_interface<ranges::iter_transform_view<ranges::transform_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/2/152/src/reaction.hpp:9:23)>,_ranges::indirected<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/2/152/src/reaction.hpp:14:23)>_>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            (&local_50,
             (view_interface<ranges::iter_transform_view<ranges::transform_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_2_152_src_reaction_hpp:9:23)>,_ranges::indirected<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_2_152_src_reaction_hpp:14:23)>_>,_(ranges::cardinality)_1>
              *)local_e8,0);
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_88,
             *(double *)
              local_50.base_.data_.
              super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>_>
              .
              super__Head_base<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_false>
              ._M_head_impl._M_current);
  bStack_9f = Catch::Matchers::WithinRelMatcher::match
                        ((WithinRelMatcher *)local_88,(double *)&local_f0);
  local_a0 = true;
  local_a8 = (undefined1  [8])&PTR_streamReconstructedExpression_001d3330;
  local_98._M_current = (double *)&local_f0;
  local_90 = (WithinRelMatcher *)local_88;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_a8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_a8);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_88);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_e8 = (undefined1  [8])0x184484;
  local_e0 = (pointer)0x124;
  macroName_44.m_size = 10;
  macroName_44.m_start = "CHECK_THAT";
  capturedExpression_44.m_size = 0x2f;
  capturedExpression_44.m_start = "1.375705e+1, WithinRel( chunk.elastic()[1][0] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_44,(SourceLineInfo *)local_e8,capturedExpression_44,
             ContinueOnFailure);
  local_f0 = 0x402b839c0ebedfa4;
  njoy::ENDFtk::section::Type<2,_152>::elastic
            ((invoke_result_t<ranges::views::transform_base_fn,_ranges::transform_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_2_152_src_reaction_hpp:9:23)>_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_2_152_src_reaction_hpp:14:23)>
              *)local_e8,chunk);
  ranges::
  view_interface<ranges::iter_transform_view<ranges::transform_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/2/152/src/reaction.hpp:9:23)>,_ranges::indirected<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/2/152/src/reaction.hpp:14:23)>_>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            (&local_50,
             (view_interface<ranges::iter_transform_view<ranges::transform_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_2_152_src_reaction_hpp:9:23)>,_ranges::indirected<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_2_152_src_reaction_hpp:14:23)>_>,_(ranges::cardinality)_1>
              *)local_e8,1);
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_88,
             *(double *)
              local_50.base_.data_.
              super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>_>
              .
              super__Head_base<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_false>
              ._M_head_impl._M_current);
  bStack_9f = Catch::Matchers::WithinRelMatcher::match
                        ((WithinRelMatcher *)local_88,(double *)&local_f0);
  local_a0 = true;
  local_a8 = (undefined1  [8])&PTR_streamReconstructedExpression_001d3330;
  local_98._M_current = (double *)&local_f0;
  local_90 = (WithinRelMatcher *)local_88;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_a8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_a8);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_88);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_e8 = (undefined1  [8])0x184484;
  local_e0 = (pointer)0x125;
  macroName_45.m_size = 10;
  macroName_45.m_start = "CHECK_THAT";
  capturedExpression_45.m_size = 0x2f;
  capturedExpression_45.m_start = "1.156033e+1, WithinRel( chunk.elastic()[2][0] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_45,(SourceLineInfo *)local_e8,capturedExpression_45,
             ContinueOnFailure);
  local_f0 = 0x40271ee392e1ef74;
  njoy::ENDFtk::section::Type<2,_152>::elastic
            ((invoke_result_t<ranges::views::transform_base_fn,_ranges::transform_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_2_152_src_reaction_hpp:9:23)>_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_2_152_src_reaction_hpp:14:23)>
              *)local_e8,chunk);
  ranges::
  view_interface<ranges::iter_transform_view<ranges::transform_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/2/152/src/reaction.hpp:9:23)>,_ranges::indirected<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/2/152/src/reaction.hpp:14:23)>_>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            (&local_50,
             (view_interface<ranges::iter_transform_view<ranges::transform_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_2_152_src_reaction_hpp:9:23)>,_ranges::indirected<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_2_152_src_reaction_hpp:14:23)>_>,_(ranges::cardinality)_1>
              *)local_e8,2);
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_88,
             *(double *)
              local_50.base_.data_.
              super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>_>
              .
              super__Head_base<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_false>
              ._M_head_impl._M_current);
  bStack_9f = Catch::Matchers::WithinRelMatcher::match
                        ((WithinRelMatcher *)local_88,(double *)&local_f0);
  local_a0 = true;
  local_a8 = (undefined1  [8])&PTR_streamReconstructedExpression_001d3330;
  local_98._M_current = (double *)&local_f0;
  local_90 = (WithinRelMatcher *)local_88;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_a8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_a8);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_88);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_e8 = (undefined1  [8])0x184484;
  local_e0 = (pointer)0x126;
  macroName_46.m_size = 10;
  macroName_46.m_start = "CHECK_THAT";
  capturedExpression_46.m_size = 0x2f;
  capturedExpression_46.m_start = "4.234708e+0, WithinRel( chunk.fission()[0][0] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_46,(SourceLineInfo *)local_e8,capturedExpression_46,
             ContinueOnFailure);
  local_f0 = 0x4010f0574b407033;
  njoy::ENDFtk::section::Type<2,_152>::fission
            ((invoke_result_t<ranges::views::transform_base_fn,_ranges::transform_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_2_152_src_reaction_hpp:9:23)>_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_2_152_src_reaction_hpp:14:23)>
              *)local_e8,chunk);
  ranges::
  view_interface<ranges::iter_transform_view<ranges::transform_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/2/152/src/reaction.hpp:9:23)>,_ranges::indirected<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/2/152/src/reaction.hpp:14:23)>_>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            (&local_50,
             (view_interface<ranges::iter_transform_view<ranges::transform_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_2_152_src_reaction_hpp:9:23)>,_ranges::indirected<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_2_152_src_reaction_hpp:14:23)>_>,_(ranges::cardinality)_1>
              *)local_e8,0);
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_88,
             *(double *)
              local_50.base_.data_.
              super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>_>
              .
              super__Head_base<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_false>
              ._M_head_impl._M_current);
  bStack_9f = Catch::Matchers::WithinRelMatcher::match
                        ((WithinRelMatcher *)local_88,(double *)&local_f0);
  local_a0 = true;
  local_a8 = (undefined1  [8])&PTR_streamReconstructedExpression_001d3330;
  local_98._M_current = (double *)&local_f0;
  local_90 = (WithinRelMatcher *)local_88;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_a8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_a8);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_88);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_e8 = (undefined1  [8])0x184484;
  local_e0 = (pointer)0x127;
  macroName_47.m_size = 10;
  macroName_47.m_start = "CHECK_THAT";
  capturedExpression_47.m_size = 0x2f;
  capturedExpression_47.m_start = "2.725074e+0, WithinRel( chunk.fission()[1][0] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_47,(SourceLineInfo *)local_e8,capturedExpression_47,
             ContinueOnFailure);
  local_f0 = 0x4005ccf398e97072;
  njoy::ENDFtk::section::Type<2,_152>::fission
            ((invoke_result_t<ranges::views::transform_base_fn,_ranges::transform_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_2_152_src_reaction_hpp:9:23)>_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_2_152_src_reaction_hpp:14:23)>
              *)local_e8,chunk);
  ranges::
  view_interface<ranges::iter_transform_view<ranges::transform_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/2/152/src/reaction.hpp:9:23)>,_ranges::indirected<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/2/152/src/reaction.hpp:14:23)>_>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            (&local_50,
             (view_interface<ranges::iter_transform_view<ranges::transform_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_2_152_src_reaction_hpp:9:23)>,_ranges::indirected<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_2_152_src_reaction_hpp:14:23)>_>,_(ranges::cardinality)_1>
              *)local_e8,1);
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_88,
             *(double *)
              local_50.base_.data_.
              super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>_>
              .
              super__Head_base<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_false>
              ._M_head_impl._M_current);
  bStack_9f = Catch::Matchers::WithinRelMatcher::match
                        ((WithinRelMatcher *)local_88,(double *)&local_f0);
  local_a0 = true;
  local_a8 = (undefined1  [8])&PTR_streamReconstructedExpression_001d3330;
  local_98._M_current = (double *)&local_f0;
  local_90 = (WithinRelMatcher *)local_88;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_a8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_a8);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_88);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_e8 = (undefined1  [8])0x184484;
  local_e0 = (pointer)0x128;
  macroName_48.m_size = 10;
  macroName_48.m_start = "CHECK_THAT";
  capturedExpression_48.m_size = 0x2f;
  capturedExpression_48.m_start = "1.572008e+0, WithinRel( chunk.fission()[2][0] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_48,(SourceLineInfo *)local_e8,capturedExpression_48,
             ContinueOnFailure);
  local_f0 = 0x3ff926f1dc50ce4f;
  njoy::ENDFtk::section::Type<2,_152>::fission
            ((invoke_result_t<ranges::views::transform_base_fn,_ranges::transform_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_2_152_src_reaction_hpp:9:23)>_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_2_152_src_reaction_hpp:14:23)>
              *)local_e8,chunk);
  ranges::
  view_interface<ranges::iter_transform_view<ranges::transform_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/2/152/src/reaction.hpp:9:23)>,_ranges::indirected<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/2/152/src/reaction.hpp:14:23)>_>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            (&local_50,
             (view_interface<ranges::iter_transform_view<ranges::transform_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_2_152_src_reaction_hpp:9:23)>,_ranges::indirected<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_2_152_src_reaction_hpp:14:23)>_>,_(ranges::cardinality)_1>
              *)local_e8,2);
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_88,
             *(double *)
              local_50.base_.data_.
              super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>_>
              .
              super__Head_base<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_false>
              ._M_head_impl._M_current);
  bStack_9f = Catch::Matchers::WithinRelMatcher::match
                        ((WithinRelMatcher *)local_88,(double *)&local_f0);
  local_a0 = true;
  local_a8 = (undefined1  [8])&PTR_streamReconstructedExpression_001d3330;
  local_98._M_current = (double *)&local_f0;
  local_90 = (WithinRelMatcher *)local_88;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_a8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_a8);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_88);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_e8 = (undefined1  [8])0x184484;
  local_e0 = (pointer)0x129;
  macroName_49.m_size = 10;
  macroName_49.m_start = "CHECK_THAT";
  capturedExpression_49.m_size = 0x2f;
  capturedExpression_49.m_start = "2.424629e+0, WithinRel( chunk.capture()[0][0] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_49,(SourceLineInfo *)local_e8,capturedExpression_49,
             ContinueOnFailure);
  local_f0 = 0x400365a3e39f7729;
  njoy::ENDFtk::section::Type<2,_152>::capture
            ((invoke_result_t<ranges::views::transform_base_fn,_ranges::transform_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_2_152_src_reaction_hpp:9:23)>_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_2_152_src_reaction_hpp:14:23)>
              *)local_e8,chunk);
  ranges::
  view_interface<ranges::iter_transform_view<ranges::transform_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/2/152/src/reaction.hpp:9:23)>,_ranges::indirected<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/2/152/src/reaction.hpp:14:23)>_>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            (&local_50,
             (view_interface<ranges::iter_transform_view<ranges::transform_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_2_152_src_reaction_hpp:9:23)>,_ranges::indirected<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_2_152_src_reaction_hpp:14:23)>_>,_(ranges::cardinality)_1>
              *)local_e8,0);
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_88,
             *(double *)
              local_50.base_.data_.
              super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>_>
              .
              super__Head_base<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_false>
              ._M_head_impl._M_current);
  bStack_9f = Catch::Matchers::WithinRelMatcher::match
                        ((WithinRelMatcher *)local_88,(double *)&local_f0);
  local_a0 = true;
  local_a8 = (undefined1  [8])&PTR_streamReconstructedExpression_001d3330;
  local_98._M_current = (double *)&local_f0;
  local_90 = (WithinRelMatcher *)local_88;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_a8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_a8);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_88);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_e8 = (undefined1  [8])0x184484;
  local_e0 = (pointer)0x12a;
  macroName_50.m_size = 10;
  macroName_50.m_start = "CHECK_THAT";
  capturedExpression_50.m_size = 0x2f;
  capturedExpression_50.m_start = "2.753559e+0, WithinRel( chunk.capture()[1][0] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_50,(SourceLineInfo *)local_e8,capturedExpression_50,
             ContinueOnFailure);
  local_f0 = 0x40060749f0e4da0a;
  njoy::ENDFtk::section::Type<2,_152>::capture
            ((invoke_result_t<ranges::views::transform_base_fn,_ranges::transform_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_2_152_src_reaction_hpp:9:23)>_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_2_152_src_reaction_hpp:14:23)>
              *)local_e8,chunk);
  ranges::
  view_interface<ranges::iter_transform_view<ranges::transform_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/2/152/src/reaction.hpp:9:23)>,_ranges::indirected<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/2/152/src/reaction.hpp:14:23)>_>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            (&local_50,
             (view_interface<ranges::iter_transform_view<ranges::transform_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_2_152_src_reaction_hpp:9:23)>,_ranges::indirected<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_2_152_src_reaction_hpp:14:23)>_>,_(ranges::cardinality)_1>
              *)local_e8,1);
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_88,
             *(double *)
              local_50.base_.data_.
              super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>_>
              .
              super__Head_base<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_false>
              ._M_head_impl._M_current);
  bStack_9f = Catch::Matchers::WithinRelMatcher::match
                        ((WithinRelMatcher *)local_88,(double *)&local_f0);
  local_a0 = true;
  local_a8 = (undefined1  [8])&PTR_streamReconstructedExpression_001d3330;
  local_98._M_current = (double *)&local_f0;
  local_90 = (WithinRelMatcher *)local_88;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_a8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_a8);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_88);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_e8 = (undefined1  [8])0x184484;
  local_e0 = (pointer)0x12b;
  macroName_51.m_size = 10;
  macroName_51.m_start = "CHECK_THAT";
  capturedExpression_51.m_size = 0x2f;
  capturedExpression_51.m_start = "5.280525e-1, WithinRel( chunk.capture()[2][0] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_51,(SourceLineInfo *)local_e8,capturedExpression_51,
             ContinueOnFailure);
  local_f0 = 0x3fe0e5ce5b4245f6;
  njoy::ENDFtk::section::Type<2,_152>::capture
            ((invoke_result_t<ranges::views::transform_base_fn,_ranges::transform_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_2_152_src_reaction_hpp:9:23)>_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_2_152_src_reaction_hpp:14:23)>
              *)local_e8,chunk);
  ranges::
  view_interface<ranges::iter_transform_view<ranges::transform_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/2/152/src/reaction.hpp:9:23)>,_ranges::indirected<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/2/152/src/reaction.hpp:14:23)>_>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            (&local_50,
             (view_interface<ranges::iter_transform_view<ranges::transform_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_2_152_src_reaction_hpp:9:23)>,_ranges::indirected<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_2_152_src_reaction_hpp:14:23)>_>,_(ranges::cardinality)_1>
              *)local_e8,2);
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_88,
             *(double *)
              local_50.base_.data_.
              super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>_>
              .
              super__Head_base<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_false>
              ._M_head_impl._M_current);
  bStack_9f = Catch::Matchers::WithinRelMatcher::match
                        ((WithinRelMatcher *)local_88,(double *)&local_f0);
  local_a0 = true;
  local_a8 = (undefined1  [8])&PTR_streamReconstructedExpression_001d3330;
  local_98._M_current = (double *)&local_f0;
  local_90 = (WithinRelMatcher *)local_88;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_a8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_a8);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_88);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_e8 = (undefined1  [8])0x184484;
  local_e0 = (pointer)0x12c;
  macroName_52.m_size = 10;
  macroName_52.m_start = "CHECK_THAT";
  capturedExpression_52.m_size = 0x3c;
  capturedExpression_52.m_start = "2.009120e+1, WithinRel( chunk.currentWeightedTotal()[0][0] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_52,(SourceLineInfo *)local_e8,capturedExpression_52,
             ContinueOnFailure);
  local_f0 = 0x40341758e219652c;
  njoy::ENDFtk::section::Type<2,_152>::currentWeightedTotal
            ((invoke_result_t<ranges::views::transform_base_fn,_ranges::transform_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_2_152_src_reaction_hpp:9:23)>_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_2_152_src_reaction_hpp:14:23)>
              *)local_e8,chunk);
  ranges::
  view_interface<ranges::iter_transform_view<ranges::transform_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/2/152/src/reaction.hpp:9:23)>,_ranges::indirected<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/2/152/src/reaction.hpp:14:23)>_>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            (&local_50,
             (view_interface<ranges::iter_transform_view<ranges::transform_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_2_152_src_reaction_hpp:9:23)>,_ranges::indirected<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_2_152_src_reaction_hpp:14:23)>_>,_(ranges::cardinality)_1>
              *)local_e8,0);
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_88,
             *(double *)
              local_50.base_.data_.
              super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>_>
              .
              super__Head_base<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_false>
              ._M_head_impl._M_current);
  bStack_9f = Catch::Matchers::WithinRelMatcher::match
                        ((WithinRelMatcher *)local_88,(double *)&local_f0);
  local_a0 = true;
  local_a8 = (undefined1  [8])&PTR_streamReconstructedExpression_001d3330;
  local_98._M_current = (double *)&local_f0;
  local_90 = (WithinRelMatcher *)local_88;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_a8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_a8);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_88);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_e8 = (undefined1  [8])0x184484;
  local_e0 = (pointer)0x12d;
  macroName_53.m_size = 10;
  macroName_53.m_start = "CHECK_THAT";
  capturedExpression_53.m_size = 0x3c;
  capturedExpression_53.m_start = "1.923568e+1, WithinRel( chunk.currentWeightedTotal()[1][0] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_53,(SourceLineInfo *)local_e8,capturedExpression_53,
             ContinueOnFailure);
  local_f0 = 0x40333c558644523f;
  njoy::ENDFtk::section::Type<2,_152>::currentWeightedTotal
            ((invoke_result_t<ranges::views::transform_base_fn,_ranges::transform_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_2_152_src_reaction_hpp:9:23)>_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_2_152_src_reaction_hpp:14:23)>
              *)local_e8,chunk);
  ranges::
  view_interface<ranges::iter_transform_view<ranges::transform_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/2/152/src/reaction.hpp:9:23)>,_ranges::indirected<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/2/152/src/reaction.hpp:14:23)>_>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            (&local_50,
             (view_interface<ranges::iter_transform_view<ranges::transform_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_2_152_src_reaction_hpp:9:23)>,_ranges::indirected<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_2_152_src_reaction_hpp:14:23)>_>,_(ranges::cardinality)_1>
              *)local_e8,1);
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_88,
             *(double *)
              local_50.base_.data_.
              super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>_>
              .
              super__Head_base<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_false>
              ._M_head_impl._M_current);
  bStack_9f = Catch::Matchers::WithinRelMatcher::match
                        ((WithinRelMatcher *)local_88,(double *)&local_f0);
  local_a0 = true;
  local_a8 = (undefined1  [8])&PTR_streamReconstructedExpression_001d3330;
  local_98._M_current = (double *)&local_f0;
  local_90 = (WithinRelMatcher *)local_88;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_a8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_a8);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_88);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_e8 = (undefined1  [8])0x184484;
  local_e0 = (pointer)0x12e;
  macroName_54.m_size = 10;
  macroName_54.m_start = "CHECK_THAT";
  capturedExpression_54.m_size = 0x3c;
  capturedExpression_54.m_start = "1.366039e+1, WithinRel( chunk.currentWeightedTotal()[2][0] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_54,(SourceLineInfo *)local_e8,capturedExpression_54,
             ContinueOnFailure);
  local_f0 = 0x402b521ea35935fc;
  njoy::ENDFtk::section::Type<2,_152>::currentWeightedTotal
            ((invoke_result_t<ranges::views::transform_base_fn,_ranges::transform_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_2_152_src_reaction_hpp:9:23)>_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_2_152_src_reaction_hpp:14:23)>
              *)local_e8,chunk);
  ranges::
  view_interface<ranges::iter_transform_view<ranges::transform_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/2/152/src/reaction.hpp:9:23)>,_ranges::indirected<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/2/152/src/reaction.hpp:14:23)>_>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            (&local_50,
             (view_interface<ranges::iter_transform_view<ranges::transform_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_2_152_src_reaction_hpp:9:23)>,_ranges::indirected<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_2_152_src_reaction_hpp:14:23)>_>,_(ranges::cardinality)_1>
              *)local_e8,2);
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_88,
             *(double *)
              local_50.base_.data_.
              super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>_>
              .
              super__Head_base<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_false>
              ._M_head_impl._M_current);
  bStack_9f = Catch::Matchers::WithinRelMatcher::match
                        ((WithinRelMatcher *)local_88,(double *)&local_f0);
  local_a0 = true;
  local_a8 = (undefined1  [8])&PTR_streamReconstructedExpression_001d3330;
  local_98._M_current = (double *)&local_f0;
  local_90 = (WithinRelMatcher *)local_88;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_a8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_a8);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_88);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_e8 = (undefined1  [8])0x184484;
  local_e0 = (pointer)0x130;
  macroName_55.m_size = 5;
  macroName_55.m_start = "CHECK";
  capturedExpression_55.m_size = 0xf;
  capturedExpression_55.m_start = "6 == chunk.NC()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_55,(SourceLineInfo *)local_e8,capturedExpression_55,
             ContinueOnFailure);
  _local_c8 = (((long)(chunk->data_).data.super__Vector_base<double,_std::allocator<double>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)(chunk->data_).data.super__Vector_base<double,_std::allocator<double>_>.
                      _M_impl.super__Vector_impl_data._M_start >> 3) + 5) / 6 + 2;
  local_e0._1_1_ = _local_c8 == 6;
  local_e0._0_1_ = true;
  local_e8 = (undefined1  [8])&PTR_streamReconstructedExpression_001d33f0;
  local_e0._4_4_ = 6;
  local_d8 = "==";
  local_d0 = (undefined1  [8])0x2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_e8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_e8);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  return;
}

Assistant:

void verifyChunkWithOneDilution( const section::Type< 2, 152 >& chunk ) {

  CHECK( 152 == chunk.MT() );
  CHECK( 152 == chunk.sectionNumber() );

  CHECK( 94239 == chunk.ZA() );
  CHECK( 94239 == chunk.targetIdentifier() );
  CHECK_THAT( 2.369986e+2, WithinRel( chunk.AWR() ) );
  CHECK_THAT( 2.369986e+2, WithinRel( chunk.atomicWeightRatio() ) );

  CHECK( 1 == chunk.LSSF() );
  CHECK( 1 == chunk.selfShieldingOnly() );
  CHECK( 2 == chunk.interpolation() );

  CHECK( 19 == chunk.NW() );
  CHECK( 19 == chunk.numberValues() );

  CHECK( 5 == chunk.NREAC() );
  CHECK( 5 == chunk.numberReactions() );
  CHECK( 1 == chunk.NSIGZ() );
  CHECK( 1 == chunk.numberDilutions() );
  CHECK( 3 == chunk.NUNR() );
  CHECK( 3 == chunk.numberEnergies() );

  CHECK_THAT( 0., WithinRel( chunk.TEMZ() ) );
  CHECK_THAT( 0., WithinRel( chunk.temperature() ) );

  CHECK( 1 == chunk.SIGZ().size() );
  CHECK( 1 == chunk.dilutions().size() );
  CHECK_THAT( 1e+10, WithinRel( chunk.SIGZ()[0] ) );
  CHECK_THAT( 1e+10, WithinRel( chunk.dilutions()[0] ) );

  CHECK( 3 == chunk.EUNR().size() );
  CHECK( 3 == chunk.energies().size() );
  CHECK_THAT( 2500., WithinRel( chunk.EUNR()[0] ) );
  CHECK_THAT( 2550., WithinRel( chunk.EUNR()[1] ) );
  CHECK_THAT( 30000., WithinRel( chunk.EUNR()[2] ) );
  CHECK_THAT( 2500., WithinRel( chunk.energies()[0] ) );
  CHECK_THAT( 2550., WithinRel( chunk.energies()[1] ) );
  CHECK_THAT( 30000., WithinRel( chunk.energies()[2] ) );

  CHECK( 3 == chunk.total().size() );
  CHECK( 3 == chunk.elastic().size() );
  CHECK( 3 == chunk.fission().size() );
  CHECK( 3 == chunk.capture().size() );
  CHECK( 3 == chunk.currentWeightedTotal().size() );
  CHECK( 1 == chunk.total()[0].size() );
  CHECK( 1 == chunk.elastic()[0].size() );
  CHECK( 1 == chunk.fission()[0].size() );
  CHECK( 1 == chunk.capture()[0].size() );
  CHECK( 1 == chunk.currentWeightedTotal()[0].size() );
  CHECK_THAT( 2.009120e+1, WithinRel( chunk.total()[0][0] ) );
  CHECK_THAT( 1.923568e+1, WithinRel( chunk.total()[1][0] ) );
  CHECK_THAT( 1.366039e+1, WithinRel( chunk.total()[2][0] ) );
  CHECK_THAT( 1.343187e+1, WithinRel( chunk.elastic()[0][0] ) );
  CHECK_THAT( 1.375705e+1, WithinRel( chunk.elastic()[1][0] ) );
  CHECK_THAT( 1.156033e+1, WithinRel( chunk.elastic()[2][0] ) );
  CHECK_THAT( 4.234708e+0, WithinRel( chunk.fission()[0][0] ) );
  CHECK_THAT( 2.725074e+0, WithinRel( chunk.fission()[1][0] ) );
  CHECK_THAT( 1.572008e+0, WithinRel( chunk.fission()[2][0] ) );
  CHECK_THAT( 2.424629e+0, WithinRel( chunk.capture()[0][0] ) );
  CHECK_THAT( 2.753559e+0, WithinRel( chunk.capture()[1][0] ) );
  CHECK_THAT( 5.280525e-1, WithinRel( chunk.capture()[2][0] ) );
  CHECK_THAT( 2.009120e+1, WithinRel( chunk.currentWeightedTotal()[0][0] ) );
  CHECK_THAT( 1.923568e+1, WithinRel( chunk.currentWeightedTotal()[1][0] ) );
  CHECK_THAT( 1.366039e+1, WithinRel( chunk.currentWeightedTotal()[2][0] ) );

  CHECK( 6 == chunk.NC() );
}